

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O2

void __thiscall jsonip::writer<true>::pre(writer<true> *this)

{
  ostream *poVar1;
  string local_40;
  
  if (this->comma == true) {
    poVar1 = std::operator<<(this->os,",");
    poVar1 = std::operator<<(poVar1,'\n');
    indent_abi_cxx11_(&local_40,this);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void pre()
        {
            if (indent_)
            {
                if (comma)
                    os << "," << '\n' << indent();
            }
            else
            {
                if (comma)
                    os << ", ";
            }
        }